

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::DiffuseAreaLight::Phi(DiffuseAreaLight *this,SampledWavelengths *lambda)

{
  Image *this_00;
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Float *pFVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  ulong uVar6;
  int c;
  int iVar7;
  Point2i p;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [64];
  undefined1 auVar17 [56];
  undefined1 auVar16 [64];
  SampledSpectrum SVar18;
  Float local_94;
  Float local_90;
  Float local_8c;
  SampledWavelengths *local_88;
  long local_80;
  DiffuseAreaLight *local_78;
  ulong local_70;
  RGB local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  RGBIlluminantSpectrum local_48;
  undefined1 auVar13 [56];
  undefined1 auVar15 [64];
  
  auVar17 = in_ZMM1._8_56_;
  auVar13 = in_ZMM0._8_56_;
  local_88 = lambda;
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    SVar18 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
    auVar16._0_8_ = SVar18.values.values._8_8_;
    auVar16._8_56_ = auVar17;
    auVar14._0_8_ = SVar18.values.values._0_8_;
    auVar14._8_56_ = auVar13;
    auVar8 = vmovlhps_avx(auVar14._0_16_,auVar16._0_16_);
  }
  else {
    TVar5 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    iVar7 = TVar5.y;
    if (iVar7 < 1) {
      auVar8 = ZEXT816(0);
    }
    else {
      this_00 = &this->image;
      auVar14 = ZEXT864(0);
      local_80 = 0;
      local_78 = this;
      do {
        if (0 < TVar5.x) {
          local_70 = local_80 << 0x20;
          uVar6 = 0;
          do {
            iVar7 = 0;
            _local_58 = auVar14._0_16_;
            local_8c = 0.0;
            local_90 = 0.0;
            local_94 = 0.0;
            p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_70 | uVar6);
            do {
              FVar10 = Image::GetChannel(this_00,p,iVar7,(WrapMode2D)0x200000002);
              this = local_78;
              pFVar4 = &local_8c;
              if (iVar7 != 0) {
                if (iVar7 == 1) {
                  pFVar4 = &local_90;
                }
                else {
                  pFVar4 = &local_94;
                }
              }
              iVar7 = iVar7 + 1;
              *pFVar4 = FVar10;
            } while (iVar7 != 3);
            auVar8 = vinsertps_avx(ZEXT416((uint)local_8c),ZEXT416((uint)local_90),0x10);
            auVar8 = vmaxps_avx(auVar8,_DAT_003ea4e0);
            auVar13 = ZEXT856(auVar8._8_8_);
            auVar9 = vmaxss_avx(ZEXT416((uint)local_94),ZEXT416(0));
            auVar17 = ZEXT856(auVar9._8_8_);
            local_68._0_8_ = vmovlps_avx(auVar8);
            local_68.b = auVar9._0_4_;
            RGBIlluminantSpectrum::RGBIlluminantSpectrum
                      (&local_48,local_78->imageColorSpace,&local_68);
            SVar18 = RGBIlluminantSpectrum::Sample(&local_48,local_88);
            auVar15._0_8_ = SVar18.values.values._8_8_;
            auVar15._8_56_ = auVar17;
            auVar12._0_8_ = SVar18.values.values._0_8_;
            auVar12._8_56_ = auVar13;
            auVar8 = vmovlhps_avx(auVar12._0_16_,auVar15._0_16_);
            TVar5 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
            uVar6 = uVar6 + 1;
            auVar14 = ZEXT1664(CONCAT412(auVar8._12_4_ + fStack_4c,
                                         CONCAT48(auVar8._8_4_ + fStack_50,
                                                  CONCAT44(auVar8._4_4_ + (float)local_58._4_4_,
                                                           auVar8._0_4_ + (float)local_58._0_4_))));
          } while ((long)uVar6 < (long)TVar5.x);
        }
        auVar8 = auVar14._0_16_;
        local_80 = local_80 + 1;
      } while (local_80 < (long)TVar5 >> 0x20);
      iVar7 = TVar5.y;
    }
    auVar9._0_4_ = (float)(TVar5.x * iVar7);
    auVar9._4_4_ = auVar9._0_4_;
    auVar9._8_4_ = auVar9._0_4_;
    auVar9._12_4_ = auVar9._0_4_;
    auVar8 = vdivps_avx(auVar8,auVar9);
  }
  fVar1 = (float)((uint)(this->twoSided & 1) * 0x40000000 +
                 (uint)!(bool)(this->twoSided & 1) * 0x3f800000);
  auVar11._0_4_ = fVar1 * auVar8._0_4_;
  auVar11._4_4_ = fVar1 * auVar8._4_4_;
  auVar11._8_4_ = fVar1 * auVar8._8_4_;
  auVar11._12_4_ = fVar1 * auVar8._12_4_;
  FVar10 = this->scale;
  auVar8._4_4_ = FVar10;
  auVar8._0_4_ = FVar10;
  auVar8._8_4_ = FVar10;
  auVar8._12_4_ = FVar10;
  auVar8 = vmulps_avx512vl(auVar11,auVar8);
  FVar10 = this->area;
  auVar2._4_4_ = FVar10;
  auVar2._0_4_ = FVar10;
  auVar2._8_4_ = FVar10;
  auVar2._12_4_ = FVar10;
  auVar8 = vmulps_avx512vl(auVar8,auVar2);
  auVar3._8_4_ = 0x40490fdb;
  auVar3._0_8_ = 0x40490fdb40490fdb;
  auVar3._12_4_ = 0x40490fdb;
  auVar9 = vmulps_avx512vl(auVar8,auVar3);
  auVar8 = vshufpd_avx(auVar9,auVar9,1);
  SVar18.values.values._0_8_ = auVar9._0_8_;
  SVar18.values.values._8_8_ = auVar8._0_8_;
  return (SampledSpectrum)SVar18.values.values;
}

Assistant:

SampledSpectrum DiffuseAreaLight::Phi(const SampledWavelengths &lambda) const {
    SampledSpectrum phi(0.f);
    if (image) {
        // Compute average light image emission
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                RGB rgb;
                for (int c = 0; c < 3; ++c)
                    rgb[c] = image.GetChannel({x, y}, c);
                phi += RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb))
                           .Sample(lambda);
            }
        phi /= image.Resolution().x * image.Resolution().y;

    } else
        phi = Lemit.Sample(lambda);
    return phi * (twoSided ? 2 : 1) * scale * area * Pi;
}